

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependent_quantity.h
# Opt level: O0

void __thiscall
geometrycentral::DependentQuantityD<Eigen::SparseMatrix<std::complex<double>,_0,_int>_>::
~DependentQuantityD(DependentQuantityD<Eigen::SparseMatrix<std::complex<double>,_0,_int>_> *this)

{
  void *in_RDI;
  
  ~DependentQuantityD((DependentQuantityD<Eigen::SparseMatrix<std::complex<double>,_0,_int>_> *)
                      0x2a9bb8);
  operator_delete(in_RDI);
  return;
}

Assistant:

DependentQuantityD(){}